

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  int iVar1;
  xmlDocPtr local_28;
  xmlNodePtr old;
  xmlNodePtr root_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((root == (xmlNodePtr)0x0) || (root->type == XML_NAMESPACE_DECL)) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    for (local_28 = (xmlDocPtr)doc->children;
        (local_28 != (xmlDocPtr)0x0 && (local_28->type != XML_ELEMENT_NODE));
        local_28 = (xmlDocPtr)local_28->next) {
    }
    if (local_28 == (xmlDocPtr)root) {
      doc_local = local_28;
    }
    else {
      xmlUnlinkNodeInternal(root);
      iVar1 = xmlSetTreeDoc(root,doc);
      if (iVar1 < 0) {
        doc_local = (xmlDocPtr)0x0;
      }
      else {
        root->parent = (_xmlNode *)doc;
        if (local_28 == (xmlDocPtr)0x0) {
          if (doc->children == (_xmlNode *)0x0) {
            doc->children = root;
            doc->last = root;
          }
          else {
            xmlAddSibling(doc->children,root);
          }
        }
        else {
          xmlReplaceNode((xmlNodePtr)local_28,root);
        }
        doc_local = local_28;
      }
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == root)
        return(old);
    xmlUnlinkNodeInternal(root);
    if (xmlSetTreeDoc(root, doc) < 0)
        return(NULL);
    root->parent = (xmlNodePtr) doc;
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}